

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::fboc::details::attTypeName_abi_cxx11_
          (string *__return_storage_ptr__,details *this,GLenum bufType)

{
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  GLenum bufType_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"none",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 == 0x1702) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"tex",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else if (local_14 == 0x8d41) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rbo",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_27);
    std::allocator<char>::~allocator(&local_27);
  }
  return __return_storage_ptr__;
}

Assistant:

string attTypeName (GLenum bufType)
{
	switch (bufType)
	{
		case GL_NONE:
			return "none";
		case GL_RENDERBUFFER:
			return "rbo";
		case GL_TEXTURE:
			return "tex";
		default:
			DE_FATAL("Impossible case");
	}
	return ""; // Shut up compiler
}